

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

bool isItRandom<ThreeWiseHash<unsigned_int,unsigned_char>>(uint L)

{
  undefined1 auVar1 [16];
  size_t k;
  undefined1 *puVar2;
  long lVar3;
  ostream *poVar4;
  pointer pCVar5;
  value_type *__val;
  uint uVar6;
  uint answer_1;
  uint uVar7;
  uint answer;
  uint uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  ThreeWiseHash<unsigned_int,_unsigned_char> hf;
  ThreeWiseHash<unsigned_int,_unsigned_char> base;
  ThreeWiseHash<unsigned_int,_unsigned_char> local_920;
  ThreeWiseHash<unsigned_int,_unsigned_char> local_4a8;
  long lVar11;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"checking that it is randomized ",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  puVar2 = (undefined1 *)operator_new(5);
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 1) = 0;
  auVar1 = _DAT_0010b070;
  lVar3 = 0;
  auVar10 = _DAT_0010b060;
  do {
    if (SUB164(auVar10 ^ auVar1,4) == -0x80000000 && SUB164(auVar10 ^ auVar1,0) < -0x7ffffffb) {
      puVar2[lVar3] = (char)lVar3;
      puVar2[lVar3 + 1] = (char)lVar3 + '\x01';
    }
    lVar3 = lVar3 + 2;
    lVar11 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 2;
    auVar10._8_8_ = lVar11 + 2;
  } while (lVar3 != 6);
  ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash(&local_4a8,5,L);
  lVar3 = 0;
  uVar8 = 0;
  pCVar5 = local_4a8.hashers.
           super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    uVar8 = uVar8 ^ pCVar5->hashvalues[(byte)puVar2[lVar3]];
    lVar3 = lVar3 + 1;
    pCVar5 = pCVar5 + 1;
  } while (lVar3 != 5);
  uVar6 = 0;
  bVar9 = true;
  do {
    ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash(&local_920,5,L);
    lVar3 = 0;
    uVar7 = 0;
    pCVar5 = local_920.hashers.
             super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar7 = uVar7 ^ pCVar5->hashvalues[(byte)puVar2[lVar3]];
      lVar3 = lVar3 + 1;
      pCVar5 = pCVar5 + 1;
    } while (lVar3 != 5);
    if (uVar7 == uVar8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"collision ",10);
      poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"It is randomized! ",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      poVar4 = (ostream *)&std::cout;
    }
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_920.hashers.
        super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_920.hashers.
                      super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
              (&local_920.ngram.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (uVar7 != uVar8) goto LAB_00106ca3;
    bVar9 = uVar6 < 99;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not randomized! ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  bVar9 = false;
LAB_00106ca3:
  if (local_4a8.hashers.
      super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4a8.hashers.
                    super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
            (&local_4a8.ngram.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
  operator_delete(puVar2);
  return bVar9;
}

Assistant:

bool isItRandom(uint L = 19) {
  cout << "checking that it is randomized " << endl;
  int n = 5;
  vector<unsigned char> data(n);
  for (int k = 0; k < n; ++k) {
    data[k] = static_cast<unsigned char>(k);
  }
  hashfunction base(n, L);
  uint64 x = base.hash(data);
  for (int k = 0; k < 100; ++k) {
    hashfunction hf(n, L);
    uint64 y = hf.hash(data);
    if (y != x) {
      cout << "It is randomized! " << endl;
      return true;
    }
    cout << "collision " << y << endl;
  }
  cout << "Not randomized! " << endl;
  return false; // we conclude that it always hashes to the same value (this is
                // bad)
}